

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgssvx.c
# Opt level: O0

void zgssvx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,double *R,double *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,double *recip_pivot_growth,double *rcond,double *ferr,double *berr,
           GlobalLU_t *Glu,mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  yes_no_t yVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  int_t *piVar10;
  int iVar11;
  int relax_00;
  int iVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  int local_1b0;
  int local_1a8;
  double local_1a0;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_168;
  double local_160;
  double local_158;
  NRformat *Astore;
  double *utime;
  double t0;
  int panel_size;
  int relax;
  double rcmin;
  double rcmax;
  double rowcnd;
  double colcnd;
  double smlnum;
  double bignum;
  double anorm;
  double amax;
  int local_e0;
  int info1;
  int j;
  int i;
  colperm_t cStack_d0;
  char norm [1];
  trans_t trant;
  int permc_spec;
  int rowequ;
  int notran;
  int nofact;
  int equil;
  int colequ;
  SuperMatrix AC;
  SuperMatrix *AA;
  int nrhs;
  int ldx;
  int ldb;
  doublecomplex *Xmat;
  doublecomplex *Bmat;
  DNformat *Xstore;
  DNformat *Bstore;
  char *equed_local;
  int *etree_local;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *A_local;
  superlu_options_t *options_local;
  
  piVar5 = (int *)B->Store;
  piVar6 = (int *)X->Store;
  lVar7 = *(long *)(piVar5 + 2);
  lVar8 = *(long *)(piVar6 + 2);
  iVar1 = *piVar5;
  iVar2 = *piVar6;
  iVar3 = B->ncol;
  *info = 0;
  bVar15 = options->Fact != FACTORED;
  yVar4 = options->Equil;
  bVar16 = options->Trans == NOTRANS;
  if (bVar15) {
    *equed = 'N';
    bVar17 = false;
    bVar18 = false;
  }
  else {
    iVar11 = strncmp(equed,"R",1);
    bVar17 = true;
    if (iVar11 != 0) {
      iVar11 = strncmp(equed,"B",1);
      bVar17 = iVar11 == 0;
    }
    iVar11 = strncmp(equed,"C",1);
    bVar18 = true;
    if (iVar11 != 0) {
      iVar11 = strncmp(equed,"B",1);
      bVar18 = iVar11 == 0;
    }
    colcnd = dmach("Safe minimum");
    smlnum = 1.0 / colcnd;
  }
  if ((((((options->Fact == DOFACT) || (options->Fact == SamePattern)) ||
        (options->Fact == SamePattern_SameRowPerm)) || (options->Fact == FACTORED)) &&
      (((options->Trans == NOTRANS || (options->Trans == TRANS)) || (options->Trans == CONJ)))) &&
     ((options->Equil == NO || (options->Equil == YES)))) {
    if ((((A->nrow == A->ncol) && (-1 < A->nrow)) && ((A->Stype == SLU_NC || (A->Stype == SLU_NR))))
       && ((A->Dtype == SLU_Z && (A->Mtype == SLU_GE)))) {
      if ((((options->Fact != FACTORED) || (bVar17)) || (bVar18)) ||
         (iVar11 = strncmp(equed,"N",1), iVar11 == 0)) {
        if (bVar17) {
          _panel_size = smlnum;
          rcmin = 0.0;
          for (local_e0 = 0; local_e0 < A->nrow; local_e0 = local_e0 + 1) {
            if (R[local_e0] <= _panel_size) {
              local_158 = R[local_e0];
            }
            else {
              local_158 = _panel_size;
            }
            _panel_size = local_158;
            if (rcmin < R[local_e0] || rcmin == R[local_e0]) {
              local_160 = R[local_e0];
            }
            else {
              local_160 = rcmin;
            }
            rcmin = local_160;
          }
          if (0.0 < _panel_size) {
            if (A->nrow < 1) {
              rcmax = 1.0;
            }
            else {
              if (_panel_size <= colcnd) {
                local_168 = colcnd;
              }
              else {
                local_168 = _panel_size;
              }
              if (smlnum <= rcmin) {
                local_178 = smlnum;
              }
              else {
                local_178 = rcmin;
              }
              rcmax = local_168 / local_178;
            }
          }
          else {
            *info = -7;
          }
        }
        if ((bVar18) && (*info == 0)) {
          _panel_size = smlnum;
          rcmin = 0.0;
          for (local_e0 = 0; local_e0 < A->nrow; local_e0 = local_e0 + 1) {
            if (C[local_e0] <= _panel_size) {
              local_180 = C[local_e0];
            }
            else {
              local_180 = _panel_size;
            }
            _panel_size = local_180;
            if (rcmin < C[local_e0] || rcmin == C[local_e0]) {
              local_188 = C[local_e0];
            }
            else {
              local_188 = rcmin;
            }
            rcmin = local_188;
          }
          if (0.0 < _panel_size) {
            if (A->nrow < 1) {
              rowcnd = 1.0;
            }
            else {
              if (_panel_size <= colcnd) {
                local_190 = colcnd;
              }
              else {
                local_190 = _panel_size;
              }
              if (smlnum <= rcmin) {
                local_1a0 = smlnum;
              }
              else {
                local_1a0 = rcmin;
              }
              rowcnd = local_190 / local_1a0;
            }
          }
          else {
            *info = -8;
          }
        }
        if (*info == 0) {
          if (lwork < -1) {
            *info = -0xc;
          }
          else if (B->ncol < 0) {
            *info = -0xd;
          }
          else if (0 < B->ncol) {
            if (A->nrow < 0) {
              local_1a8 = 0;
            }
            else {
              local_1a8 = A->nrow;
            }
            if (((*piVar5 < local_1a8) || (B->Stype != SLU_DN)) ||
               ((B->Dtype != SLU_Z || (B->Mtype != SLU_GE)))) {
              *info = -0xd;
            }
          }
          if (X->ncol < 0) {
            *info = -0xe;
          }
          else if (0 < X->ncol) {
            if (A->nrow < 0) {
              local_1b0 = 0;
            }
            else {
              local_1b0 = A->nrow;
            }
            if (((*piVar6 < local_1b0) ||
                (((B->ncol != 0 && (B->ncol != X->ncol)) || (X->Stype != SLU_DN)))) ||
               ((X->Dtype != SLU_Z || (X->Mtype != SLU_GE)))) {
              *info = -0xe;
            }
          }
        }
      }
      else {
        *info = -6;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    iVar11 = sp_ienv(1);
    relax_00 = sp_ienv(2);
    pdVar9 = stat->utime;
    if (A->Stype == SLU_NR) {
      piVar10 = (int_t *)A->Store;
      AC.Store = superlu_malloc(0x20);
      zCreate_CompCol_Matrix
                ((SuperMatrix *)AC.Store,A->ncol,A->nrow,*piVar10,*(doublecomplex **)(piVar10 + 2),
                 *(int_t **)(piVar10 + 4),*(int_t **)(piVar10 + 6),SLU_NC,A->Dtype,A->Mtype);
      bVar16 = !bVar16;
      i = (int)!bVar16;
    }
    else {
      i = options->Trans;
      AC.Store = A;
    }
    if ((bVar15) && (yVar4 == YES)) {
      dVar19 = SuperLU_timer_();
      zgsequ((SuperMatrix *)AC.Store,R,C,&rcmax,&rowcnd,&anorm,(int *)((long)&amax + 4));
      if (amax._4_4_ == 0) {
        zlaqgs((SuperMatrix *)AC.Store,R,C,rcmax,rowcnd,anorm,equed);
        iVar12 = strncmp(equed,"R",1);
        bVar17 = true;
        if (iVar12 != 0) {
          iVar12 = strncmp(equed,"B",1);
          bVar17 = iVar12 == 0;
        }
        iVar12 = strncmp(equed,"C",1);
        bVar18 = true;
        if (iVar12 != 0) {
          iVar12 = strncmp(equed,"B",1);
          bVar18 = iVar12 == 0;
        }
      }
      dVar20 = SuperLU_timer_();
      pdVar9[4] = dVar20 - dVar19;
    }
    if (bVar15) {
      dVar19 = SuperLU_timer_();
      cStack_d0 = options->ColPerm;
      if ((cStack_d0 != MY_PERMC) && (options->Fact == DOFACT)) {
        get_perm_c(cStack_d0,(SuperMatrix *)AC.Store,perm_c);
      }
      dVar20 = SuperLU_timer_();
      *pdVar9 = dVar20 - dVar19;
      dVar19 = SuperLU_timer_();
      sp_preorder(options,(SuperMatrix *)AC.Store,perm_c,etree,(SuperMatrix *)&equil);
      dVar20 = SuperLU_timer_();
      pdVar9[3] = dVar20 - dVar19;
      dVar19 = SuperLU_timer_();
      zgstrf(options,(SuperMatrix *)&equil,relax_00,iVar11,etree,work,lwork,perm_c,perm_r,L,U,Glu,
             stat,info);
      dVar20 = SuperLU_timer_();
      pdVar9[7] = dVar20 - dVar19;
      if (lwork == -1) {
        mem_usage->total_needed = (float)(*info - A->ncol);
        return;
      }
    }
    if (*info < 1) {
      if (options->PivotGrowth != NO) {
        dVar19 = zPivotGrowth(A->ncol,(SuperMatrix *)AC.Store,perm_c,L,U);
        *recip_pivot_growth = dVar19;
      }
      if (options->ConditionNumber != NO) {
        dVar19 = SuperLU_timer_();
        if (bVar16) {
          j._3_1_ = 0x31;
        }
        else {
          j._3_1_ = 0x49;
        }
        bignum = zlangs((char *)((long)&j + 3),(SuperMatrix *)AC.Store);
        zgscon((char *)((long)&j + 3),L,U,bignum,rcond,stat,(int *)((long)&amax + 4));
        dVar20 = SuperLU_timer_();
        pdVar9[0x10] = dVar20 - dVar19;
      }
      if (0 < iVar3) {
        if (bVar16) {
          if (bVar17) {
            for (local_e0 = 0; local_e0 < iVar3; local_e0 = local_e0 + 1) {
              for (info1 = 0; info1 < A->nrow; info1 = info1 + 1) {
                *(double *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10) =
                     *(double *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10) * R[info1];
                *(double *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10 + 8) =
                     *(double *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10 + 8) * R[info1];
              }
            }
          }
        }
        else if (bVar18) {
          for (local_e0 = 0; local_e0 < iVar3; local_e0 = local_e0 + 1) {
            for (info1 = 0; info1 < A->nrow; info1 = info1 + 1) {
              *(double *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10) =
                   *(double *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10) * C[info1];
              *(double *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10 + 8) =
                   *(double *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10 + 8) * C[info1];
            }
          }
        }
        for (local_e0 = 0; local_e0 < iVar3; local_e0 = local_e0 + 1) {
          for (info1 = 0; info1 < B->nrow; info1 = info1 + 1) {
            puVar13 = (undefined8 *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10);
            puVar14 = (undefined8 *)(lVar7 + (long)(info1 + local_e0 * iVar1) * 0x10);
            *puVar13 = *puVar14;
            puVar13[1] = puVar14[1];
          }
        }
        dVar19 = SuperLU_timer_();
        zgstrs(i,L,U,perm_c,perm_r,X,stat,(int *)((long)&amax + 4));
        dVar20 = SuperLU_timer_();
        pdVar9[0x11] = dVar20 - dVar19;
        dVar19 = SuperLU_timer_();
        if (options->IterRefine == NOREFINE) {
          for (local_e0 = 0; local_e0 < iVar3; local_e0 = local_e0 + 1) {
            berr[local_e0] = 1.0;
            ferr[local_e0] = 1.0;
          }
        }
        else {
          zgsrfs(i,(SuperMatrix *)AC.Store,L,U,perm_c,perm_r,equed,R,C,B,X,ferr,berr,stat,
                 (int *)((long)&amax + 4));
        }
        dVar20 = SuperLU_timer_();
        pdVar9[0x12] = dVar20 - dVar19;
        if (bVar16) {
          if (bVar18) {
            for (local_e0 = 0; local_e0 < iVar3; local_e0 = local_e0 + 1) {
              for (info1 = 0; info1 < A->nrow; info1 = info1 + 1) {
                *(double *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10) =
                     *(double *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10) * C[info1];
                *(double *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10 + 8) =
                     *(double *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10 + 8) * C[info1];
              }
            }
          }
        }
        else if (bVar17) {
          for (local_e0 = 0; local_e0 < iVar3; local_e0 = local_e0 + 1) {
            for (info1 = 0; info1 < A->nrow; info1 = info1 + 1) {
              *(double *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10) =
                   *(double *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10) * R[info1];
              *(double *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10 + 8) =
                   *(double *)(lVar8 + (long)(info1 + local_e0 * iVar2) * 0x10 + 8) * R[info1];
            }
          }
        }
      }
      if ((options->ConditionNumber != NO) &&
         (dVar19 = *rcond, dVar20 = dmach("E"), dVar19 < dVar20)) {
        *info = A->ncol + 1;
      }
      if (bVar15) {
        zQuerySpace(L,U,mem_usage);
        Destroy_CompCol_Permuted((SuperMatrix *)&equil);
      }
      if (A->Stype == SLU_NR) {
        Destroy_SuperMatrix_Store((SuperMatrix *)AC.Store);
        superlu_free(AC.Store);
      }
    }
    else if (*info <= A->ncol) {
      dVar19 = zPivotGrowth(*info,(SuperMatrix *)AC.Store,perm_c,L,U);
      *recip_pivot_growth = dVar19;
    }
  }
  else {
    info1 = -*info;
    input_error("zgssvx",&info1);
  }
  return;
}

Assistant:

void
zgssvx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, double *R, double *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X, double *recip_pivot_growth, 
       double *rcond, double *ferr, double *berr, 
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info )
{

    DNformat  *Bstore, *Xstore;
    doublecomplex    *Bmat, *Xmat;
    int       ldb, ldx, nrhs;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec;
    trans_t   trant;
    char      norm[1];
    int       i, j, info1;
    double    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size;
    double    t0;      /* temporary time */
    double    *utime;

    /* External functions */
    extern double zlangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = dmach("Safe minimum");   /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

#if 0
printf("dgssvx: Fact=%4d, Trans=%4d, equed=%c\n",
       options->Fact, options->Trans, *equed);
#endif

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) || 
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	 *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 ) *info = -13;
	    else if ( B->ncol > 0 ) { /* no checking if B->ncol=0 */
	         if ( Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_Z || 
		      B->Mtype != SLU_GE )
		*info = -13;
            }
	    if ( X->ncol < 0 ) *info = -14;
            else if ( X->ncol > 0 ) { /* no checking if X->ncol=0 */
                 if ( Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
                      X->Stype != SLU_DN ||
		      X->Dtype != SLU_Z || X->Mtype != SLU_GE )
		*info = -14;
            }
	}
    }
    if (*info != 0) {
	i = -(*info);
	input_error("zgssvx", &i);
	return;
    }
    
    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;
    
    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	zCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact && equil ) {
	t0 = SuperLU_timer_();
	/* Compute row and column scalings to equilibrate the matrix A. */
	zgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);
	
	if ( info1 == 0 ) {
	    /* Equilibrate matrix A. */
	    zlaqgs(AA, R, C, rowcnd, colcnd, amax, equed);
	    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	}
	utime[EQUIL] = SuperLU_timer_() - t0;
    }


    if ( nofact ) {
	
        t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
            get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;
    
/*	printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	       relax, panel_size, sp_ienv(3), sp_ienv(4));
	fflush(stdout); */
	
	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	zgstrf(options, &AC, relax, panel_size, etree,
                work, lwork, perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;
	
	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}
    }

    if ( *info > 0 ) { 
        if ( *info <= A->ncol ) { /* singular */
	    /* Compute the reciprocal pivot growth factor of the leading
	       rank-deficient (*info) columns of A. */
	    *recip_pivot_growth = zPivotGrowth(*info, AA, perm_c, L, U);
        }
	return;
    }

    /* *info == 0 at this point. */

    if ( options->PivotGrowth ) {
        /* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
        *recip_pivot_growth = zPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
        /* Estimate the reciprocal of the condition number of A. */
        t0 = SuperLU_timer_();
        if ( notran ) {
	    *(unsigned char *)norm = '1';
        } else {
	    *(unsigned char *)norm = 'I';
        }
        anorm = zlangs(norm, AA);
        zgscon(norm, L, U, anorm, rcond, stat, &info1);
        utime[RCOND] = SuperLU_timer_() - t0;
    }
    
    if ( nrhs > 0 ) {
        /* Scale the right hand side if equilibration was performed. */
        if ( notran ) {
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        zd_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], R[i]);
	    }
        } else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    zd_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], C[i]);
        }

        /* Compute the solution matrix X. */
        for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
            for (i = 0; i < B->nrow; i++)
	        Xmat[i + j*ldx] = Bmat[i + j*ldb];
    
        t0 = SuperLU_timer_();
        zgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
        utime[SOLVE] = SuperLU_timer_() - t0;
    
        /* Use iterative refinement to improve the computed solution and compute
           error bounds and backward error estimates for it. */
        t0 = SuperLU_timer_();
        if ( options->IterRefine != NOREFINE ) {
            zgsrfs(trant, AA, L, U, perm_c, perm_r, equed, R, C, B,
                   X, ferr, berr, stat, &info1);
        } else {
            for (j = 0; j < nrhs; ++j) ferr[j] = berr[j] = 1.0;
        }
        utime[REFINE] = SuperLU_timer_() - t0;

        /* Transform the solution matrix X to a solution of the original system. */
        if ( notran ) {
	    if ( colequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        zd_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], C[i]);
	    }
        } else if ( rowequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    zd_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], R[i]);
        }
    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
        /* Set INFO = A->ncol+1 if the matrix is singular to working precision. */
        /*if ( *rcond < dlamch_("E") ) *info = A->ncol + 1;*/
        if ( *rcond < dmach("E") ) *info = A->ncol + 1;
    }

    if ( nofact ) {
        zQuerySpace(L, U, mem_usage);
        Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}